

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_>::
     init_holder<kratos::FSMState>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::FSMState> *param_4)

{
  void **ppvVar1;
  element_type *peVar2;
  bool bVar3;
  __weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::FSMState> sh;
  
  std::__weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_58,(__weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> *)*v_h->vh);
  std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,&local_58)
  ;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_58._M_refcount);
  std::dynamic_pointer_cast<kratos::FSMState,kratos::FSMState>
            ((shared_ptr<kratos::FSMState> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  peVar2 = sh.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_38 != (undefined1  [8])0x0) {
    ppvVar1 = v_h->vh;
    ppvVar1[1] = (void *)local_38;
    sh.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    ppvVar1[2] = peVar2;
    local_38 = (undefined1  [8])0x0;
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  bVar3 = pybind11::detail::value_and_holder::holder_constructed(v_h);
  if ((!bVar3) && ((inst->field_0x30 & 1) != 0)) {
    std::__shared_ptr<kratos::FSMState,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::FSMState,void>
              ((__shared_ptr<kratos::FSMState,(__gnu_cxx::_Lock_policy)2> *)(v_h->vh + 1),
               (FSMState *)*v_h->vh);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sh);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }